

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O2

int i2d_ASN1_OBJECT(ASN1_OBJECT *a,uchar **pp)

{
  int iVar1;
  int line;
  CBB cbb;
  CBB child;
  
  if (a == (ASN1_OBJECT *)0x0) {
    iVar1 = 0x43;
    line = 0x20;
  }
  else {
    if (0 < a->length) {
      iVar1 = CBB_init(&cbb,(ulong)(uint)a->length + 2);
      if (((iVar1 != 0) && (iVar1 = CBB_add_asn1(&cbb,&child,6), iVar1 != 0)) &&
         (iVar1 = CBB_add_bytes(&child,a->data,(long)a->length), iVar1 != 0)) {
        iVar1 = CBB_finish_i2d(&cbb,pp);
        return iVar1;
      }
      CBB_cleanup(&cbb);
      return -1;
    }
    line = 0x25;
    iVar1 = 0x86;
  }
  ERR_put_error(0xc,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/a_object.cc"
                ,line);
  return -1;
}

Assistant:

int i2d_ASN1_OBJECT(const ASN1_OBJECT *in, unsigned char **outp) {
  if (in == NULL) {
    OPENSSL_PUT_ERROR(ASN1, ERR_R_PASSED_NULL_PARAMETER);
    return -1;
  }

  if (in->length <= 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_ILLEGAL_OBJECT);
    return -1;
  }

  CBB cbb, child;
  if (!CBB_init(&cbb, (size_t)in->length + 2) ||
      !CBB_add_asn1(&cbb, &child, CBS_ASN1_OBJECT) ||
      !CBB_add_bytes(&child, in->data, in->length)) {
    CBB_cleanup(&cbb);
    return -1;
  }

  return CBB_finish_i2d(&cbb, outp);
}